

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_cross_trade *m)

{
  bool bVar1;
  pointer ppVar2;
  uint64_t timestamp;
  event *__args;
  long in_RSI;
  nordic_itch_handler *in_RDI;
  trade t;
  order_book *ob;
  uint64_t quantity;
  uint64_t cross_price;
  iterator it;
  uint64_t order_book_id;
  unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
  *in_stack_ffffffffffffff28;
  trade *this_00;
  trade *t_00;
  undefined1 local_a0 [64];
  trade local_60;
  order_book *local_40;
  uint64_t local_38;
  uint64_t local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book>,_false> local_20;
  uint64_t local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_18 = itch_uatoi((char *)(in_RSI + 10),6);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x14ff38);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    local_30 = itch_uatoi((char *)(local_10 + 0x10),10);
    local_38 = itch_uatoi((char *)(local_10 + 1),9);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book>,_false,_false>
                         *)0x14ffbc);
    local_40 = &ppVar2->second;
    timestamp = nordic_itch_handler::timestamp(in_RDI);
    this_00 = &local_60;
    trade::trade(this_00,timestamp,local_30,local_38,crossing);
    t_00 = (trade *)&in_RDI->_process_event;
    __args = (event *)order_book::symbol_abi_cxx11_(local_40);
    nordic_itch_handler::timestamp(in_RDI);
    make_trade_event((string *)in_RDI,(uint64_t)local_a0,t_00,(event_mask)((ulong)this_00 >> 0x20));
    std::function<void_(const_helix::event_&)>::operator()
              ((function<void_(const_helix::event_&)> *)this_00,__args);
    event::~event((event *)0x15005c);
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_cross_trade* m)
{
    auto order_book_id = itch_uatoi(m->OrderBook, sizeof(m->OrderBook));
    auto it = order_book_id_map.find(order_book_id);
    if (it != order_book_id_map.end()) {
        uint64_t cross_price = itch_uatoi(m->CrossPrice, sizeof(m->CrossPrice));
        uint64_t quantity = itch_uatoi(m->Quantity, sizeof(m->Quantity));
        auto& ob = it->second;
        trade t{timestamp(), cross_price, quantity, trade_sign::crossing};
        _process_event(make_trade_event(ob.symbol(), timestamp(), &t));
    }
}